

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_list_item.c
# Opt level: O0

int run_tvf(void)

{
  int iVar1;
  wchar_t wVar2;
  char *str;
  char *__s1;
  int local_1c;
  int exact_tvf_check;
  char *lc_time;
  char *orig_lc_time;
  
  str = getenv("LC_TIME");
  set_lc_time("en_US.UTF-8");
  __s1 = getenv("LC_TIME");
  if (__s1 != (char *)0x0) {
    iVar1 = strcmp(__s1,"en_US.UTF-8");
    if (iVar1 == 0) {
      local_1c = 1;
      goto LAB_0010c800;
    }
  }
  local_1c = 0;
LAB_0010c800:
  wVar2 = systemf("%s tvf test_list_item.tar >tvf.out 2>tvf.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_list_item.c"
                      ,L'Q',0,"0",(long)wVar2,
                      "systemf(\"%s tvf test_list_item.tar >tvf.out 2>tvf.err\", testprog)",
                      (void *)0x0);
  if (str != (char *)0x0) {
    set_lc_time(str);
  }
  return local_1c;
}

Assistant:

static int
run_tvf(void)
{
	char * orig_lc_time;
	char * lc_time;
	int exact_tvf_check;

	orig_lc_time = getenv("LC_TIME");

	/* Try to set LC_TIME to known (English) dates. */
	set_lc_time("en_US.UTF-8");

	/* Check if we've got the right LC_TIME; if not, don't check output. */
	lc_time = getenv("LC_TIME");
	if ((lc_time != NULL) && strcmp(lc_time, "en_US.UTF-8") == 0)
		exact_tvf_check = 1;
	else
		exact_tvf_check = 0;

	assertEqualInt(0,
	    systemf("%s tvf test_list_item.tar >tvf.out 2>tvf.err", testprog));

	/* Restore the original date formatting. */
	if (orig_lc_time != NULL)
		set_lc_time(orig_lc_time);

	return (exact_tvf_check);
}